

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QtPrivate::QTypeNormalizer::starts_with_token(char *b,char *e,char *token,bool msvcKw)

{
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar1;
  byte local_23;
  char *local_20;
  char *local_10;
  bool local_1;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  while( true ) {
    bVar1 = false;
    if ((local_10 != in_RSI) && (bVar1 = false, *local_20 != '\0')) {
      bVar1 = *local_10 == *local_20;
    }
    if (!bVar1) break;
    local_10 = local_10 + 1;
    local_20 = local_20 + 1;
  }
  if (*local_20 == '\0') {
    local_23 = 1;
    if (local_10 != in_RSI) {
      bVar1 = is_ident_char(*local_10);
      local_23 = bVar1 ^ 0xff;
    }
    local_1 = (bool)(local_23 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static constexpr bool starts_with_token(const char *b, const char *e, const char *token,
                                            bool msvcKw = false)
    {
        while (b != e && *token && *b == *token) {
            b++;
            token++;
        }
        if (*token)
            return false;
#ifdef Q_CC_MSVC
        /// On MSVC, keywords like class or struct are not separated with spaces in constexpr
        /// context
        if (msvcKw && !is_ident_char(*b))
            return true;
#endif
        Q_UNUSED(msvcKw);
        return b == e || !is_ident_char(*b);
    }